

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PushID(void *ptr_id)

{
  ImGuiWindow *this;
  ImGuiID id;
  ImGuiID local_c;
  
  this = GImGui->CurrentWindow;
  local_c = ImGuiWindow::GetIDNoKeepAlive(this,ptr_id);
  ImVector<unsigned_int>::push_back(&this->IDStack,&local_c);
  return;
}

Assistant:

void ImGui::PushID(const void* ptr_id)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiID id = window->GetIDNoKeepAlive(ptr_id);
    window->IDStack.push_back(id);
}